

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestoutOfOrder::RunImpl(TestoutOfOrder *this)

{
  TestResults *results;
  char *__s;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator<char> local_189;
  string local_188;
  Message local_168 [8];
  Message object;
  TestoutOfOrder *this_local;
  
  FIX::Message::Message(local_168);
  __s = RunImpl::str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,__s,&local_189);
  FIX::Message::setString(local_168,&local_188,false);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&local_1c0,(int)local_168,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1e0,*ppTVar2,0x1a2);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::expected,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST(outOfOrder)
{
  FIX::Message object;
  static const char * str =
    "54=1\00120=0\00131=109.03125\00160=00000000-00:00:00\001"
    "8=FIX.4.2\0016=109.03125\0011=acct1\001151=0\001150=2\001"
    "17=2\00139=2\00138=3000\00149=MEK\00115=USD\00137=1\001"
    "48=123ABC789\00114=3000\00135=8\00156=KEM\00134=2\001"
    "55=ABCD\00111=ID1\00122=1\001";

  static const char * expected =
    "8=FIX.4.2\0019=171\00135=8\00134=2\00149=MEK\00156=KEM\0011=acct1\001"
    "6=109.03125\00111=ID1\00114=3000\00115=USD\00117=2\00120=0\00122=1\001"
    "31=109.03125\00137=1\00138=3000\00139=2\00148=123ABC789\001"
    "54=1\00155=ABCD\00160=00000000-00:00:00\001150=2\001151=0\00110=225\001";

  object.setString( str, false );
  CHECK_EQUAL( expected, object.toString() );
}